

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O0

void __thiscall leveldb::Block::Iter::CorruptionError(Iter *this)

{
  Status *in_RDI;
  Slice *in_stack_ffffffffffffffd0;
  Slice *in_stack_ffffffffffffffd8;
  
  *(undefined4 *)&in_RDI[8].state_ = *(undefined4 *)&in_RDI[7].state_;
  *(undefined4 *)((long)&in_RDI[8].state_ + 4) = *(undefined4 *)((long)&in_RDI[7].state_ + 4);
  Slice::Slice(in_stack_ffffffffffffffd0,(char *)in_RDI);
  Slice::Slice((Slice *)&stack0xffffffffffffffd0);
  Status::Corruption(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  Status::operator=((Status *)in_stack_ffffffffffffffd0,in_RDI);
  Status::~Status((Status *)in_stack_ffffffffffffffd0);
  std::__cxx11::string::clear();
  Slice::clear((Slice *)(in_RDI + 0xd));
  return;
}

Assistant:

void CorruptionError() {
    current_ = restarts_;
    restart_index_ = num_restarts_;
    status_ = Status::Corruption("bad entry in block");
    key_.clear();
    value_.clear();
  }